

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O0

void close_connection(MQTT_CLIENT *mqtt_client)

{
  bool local_19;
  ulong local_18;
  size_t counter;
  MQTT_CLIENT *mqtt_client_local;
  
  if ((mqtt_client->mqtt_status & 2) == 0) {
    mqtt_client->mqtt_status = mqtt_client->mqtt_status & 0xfffd;
    if (mqtt_client->disconnect_cb != (ON_MQTT_DISCONNECTED_CALLBACK)0x0) {
      (*mqtt_client->disconnect_cb)(mqtt_client->disconnect_ctx);
    }
  }
  else {
    xio_close(mqtt_client->xioHandle,on_connection_closed,mqtt_client);
    if (mqtt_client->disconnect_cb == (ON_MQTT_DISCONNECTED_CALLBACK)0x0) {
      local_18 = 0;
      do {
        xio_dowork(mqtt_client->xioHandle);
        local_18 = local_18 + 1;
        ThreadAPI_Sleep(2);
        local_19 = (mqtt_client->mqtt_status & 2) != 0 && local_18 < 0x14;
      } while (local_19);
    }
    mqtt_client->xioHandle = (XIO_HANDLE)0x0;
  }
  return;
}

Assistant:

static void close_connection(MQTT_CLIENT* mqtt_client)
{
    if (mqtt_client->mqtt_status & MQTT_STATUS_SOCKET_CONNECTED)
    {
        (void)xio_close(mqtt_client->xioHandle, on_connection_closed, mqtt_client);
        if (mqtt_client->disconnect_cb == NULL)
        {
            size_t counter = 0;
            do
            {
                xio_dowork(mqtt_client->xioHandle);
                counter++;
                ThreadAPI_Sleep(2);
            } while (mqtt_client->mqtt_status & MQTT_STATUS_SOCKET_CONNECTED && counter < MAX_CLOSE_RETRIES);
        }
        // Clear the handle because we don't use it anymore
        mqtt_client->xioHandle = NULL;
    }
    else
    {
        mqtt_client->mqtt_status &= ~MQTT_STATUS_SOCKET_CONNECTED;
        if (mqtt_client->disconnect_cb)
        {
            mqtt_client->disconnect_cb(mqtt_client->disconnect_ctx);
        }
    }
}